

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorUtil.c
# Opt level: O0

int CountLiteralsCheck(void)

{
  varvalue vVar1;
  uint local_20;
  uint local_1c;
  int LitCounterControl;
  int LitCounter;
  int v;
  int Value;
  Cube *p;
  
  local_1c = 0;
  local_20 = 0;
  _v = IterCubeSetStart();
  while( true ) {
    if (_v == (Cube *)0x0) {
      if (local_20 != local_1c) {
        printf("Warning! The recorded number of literals (%d) differs from the actual number (%d)\n"
               ,(ulong)local_20,(ulong)local_1c);
      }
      return local_1c;
    }
    local_20 = (int)_v->a + local_20;
    if (_v->fMark != '\0') break;
    for (LitCounterControl = 0; LitCounterControl < g_CoverInfo.nVarsIn;
        LitCounterControl = LitCounterControl + 1) {
      vVar1 = GetVar(_v,LitCounterControl);
      if (vVar1 == VAR_NEG) {
        local_1c = local_1c + 1;
      }
      else if (vVar1 == VAR_POS) {
        local_1c = local_1c + 1;
      }
      else if (vVar1 != VAR_ABS) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/exor/exorUtil.c"
                      ,0x6d,"int CountLiteralsCheck()");
      }
    }
    _v = IterCubeSetNext();
  }
  __assert_fail("p->fMark == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/exor/exorUtil.c"
                ,0x61,"int CountLiteralsCheck()");
}

Assistant:

int CountLiteralsCheck()
{
    Cube* p;
    int Value, v;
    int LitCounter = 0;
    int LitCounterControl = 0;

    for ( p = IterCubeSetStart( ); p; p = IterCubeSetNext() )
    {
        LitCounterControl += p->a;

        assert( p->fMark == 0 );

        // write the input variables
        for ( v = 0; v < g_CoverInfo.nVarsIn; v++ )
        {
            Value = GetVar( p, v );
            if ( Value == VAR_NEG )
                LitCounter++;
            else if ( Value == VAR_POS )
                LitCounter++;
            else if ( Value != VAR_ABS )
            {
                assert(0);
            }
        }
    }

    if ( LitCounterControl != LitCounter )
        printf( "Warning! The recorded number of literals (%d) differs from the actual number (%d)\n", LitCounterControl, LitCounter );
    return LitCounter;
}